

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void ERRLOGImpl(char *errMsg)

{
  size_t __n;
  size_t nErrmsg;
  size_t writeSize;
  char buff [1024];
  char *errMsg_local;
  
  writeSize._0_4_ = 0x4f525245;
  writeSize._4_2_ = 0x3a52;
  writeSize._6_1_ = 0x20;
  __n = strlen(errMsg);
  memcpy((void *)((long)&writeSize + 7),errMsg,__n);
  buff[__n - 1] = '\n';
  WriteLogImpl((char *)&writeSize,__n + 8);
  return;
}

Assistant:

void ERRLOGImpl(const char * errMsg)
{
	char buff[1024];
	memcpy(buff, "ERROR: ", 7);
	size_t writeSize = 7;
	size_t nErrmsg = strlen(errMsg);
	memcpy(buff + writeSize, errMsg, nErrmsg);
	writeSize += nErrmsg;
	// FIX ME may overflow
	buff[writeSize] = '\n';
	writeSize += 1;
	WriteLogImpl(buff, writeSize);
}